

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)17>_> * __thiscall
vkt::api::anon_unknown_0::ImageClearingTestInstance::createRenderPass
          (Move<vk::Handle<(vk::HandleType)17>_> *__return_storage_ptr__,
          ImageClearingTestInstance *this,VkFormat format)

{
  undefined1 local_118 [8];
  VkRenderPassCreateInfo renderPassCreateInfo;
  VkSubpassDescription subpassDesc [1];
  deUint32 colorAttachmentCount;
  VkAttachmentReference *pDepthStencilAttachment;
  VkAttachmentReference *pColorAttachments;
  VkAttachmentReference attachmentRef;
  VkAttachmentDescription attachments [1];
  VkAttachmentDescription attachmentDesc;
  VkImageLayout imageLayout;
  VkFormat format_local;
  ImageClearingTestInstance *this_local;
  
  ::vk::isDepthStencilFormat(format);
  attachments[0].initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  attachments[0].finalLayout = format;
  memcpy(&attachmentRef,&attachments[0].initialLayout,0x24);
  ::vk::isDepthStencilFormat(format);
  renderPassCreateInfo.pDependencies._0_4_ = 0;
  renderPassCreateInfo.pDependencies._4_4_ = 0;
  local_118._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassCreateInfo._4_4_ = 0;
  renderPassCreateInfo.pNext._0_4_ = 0;
  renderPassCreateInfo.pNext._4_4_ = 1;
  renderPassCreateInfo._16_8_ = &attachmentRef;
  renderPassCreateInfo.pAttachments._0_4_ = 1;
  renderPassCreateInfo._32_8_ = &renderPassCreateInfo.pDependencies;
  renderPassCreateInfo.pSubpasses._0_4_ = 0;
  renderPassCreateInfo.dependencyCount = 0;
  renderPassCreateInfo._52_4_ = 0;
  ::vk::createRenderPass
            (__return_storage_ptr__,this->m_vkd,this->m_device,(VkRenderPassCreateInfo *)local_118,
             (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkRenderPass> ImageClearingTestInstance::createRenderPass (VkFormat format) const
{
	VkImageLayout							imageLayout;

	if (isDepthStencilFormat(format))
		imageLayout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
	else
		imageLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;

	const VkAttachmentDescription			attachmentDesc			=
	{
		0u,													// VkAttachmentDescriptionFlags		flags;
		format,												// VkFormat							format;
		VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
		VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				loadOp;
		VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
		VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				stencilLoadOp;
		VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				stencilStoreOp;
		imageLayout,										// VkImageLayout					initialLayout;
		imageLayout,										// VkImageLayout					finalLayout;
	};

	const VkAttachmentDescription			attachments[1]			=
	{
		attachmentDesc
	};

	const VkAttachmentReference				attachmentRef			=
	{
		0u,													// deUint32							attachment;
		imageLayout,										// VkImageLayout					layout;
	};

	const VkAttachmentReference*			pColorAttachments		= DE_NULL;
	const VkAttachmentReference*			pDepthStencilAttachment	= DE_NULL;
	deUint32								colorAttachmentCount	= 1;

	if (isDepthStencilFormat(format))
	{
		colorAttachmentCount	= 0;
		pDepthStencilAttachment	= &attachmentRef;
	}
	else
	{
		colorAttachmentCount	= 1;
		pColorAttachments		= &attachmentRef;
	}

	const VkSubpassDescription				subpassDesc[1]			=
	{
		{
			0u,												// VkSubpassDescriptionFlags		flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,				// VkPipelineBindPoint				pipelineBindPoint;
			0u,												// deUint32							inputAttachmentCount;
			DE_NULL,										// const VkAttachmentReference*		pInputAttachments;
			colorAttachmentCount,							// deUint32							colorAttachmentCount;
			pColorAttachments,								// const VkAttachmentReference*		pColorAttachments;
			DE_NULL,										// const VkAttachmentReference*		pResolveAttachments;
			pDepthStencilAttachment,						// const VkAttachmentReference*		pDepthStencilAttachment;
			0u,												// deUint32							preserveAttachmentCount;
			DE_NULL,										// const VkAttachmentReference*		pPreserveAttachments;
		}
	};

	const VkRenderPassCreateInfo			renderPassCreateInfo	=
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,			// VkStructureType					sType;
		DE_NULL,											// const void*						pNext;
		0u,													// VkRenderPassCreateFlags			flags;
		1u,													// deUint32							attachmentCount;
		attachments,										// const VkAttachmentDescription*	pAttachments;
		1u,													// deUint32							subpassCount;
		subpassDesc,										// const VkSubpassDescription*		pSubpasses;
		0u,													// deUint32							dependencyCount;
		DE_NULL,											// const VkSubpassDependency*		pDependencies;
	};

	return vk::createRenderPass(m_vkd, m_device, &renderPassCreateInfo, DE_NULL);
}